

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

Attribute * attrsInstall(TidyDocImpl *doc,TidyAttribImpl *attribs,Attribute *old)

{
  uint uVar1;
  AttrHash *pAVar2;
  uint hashval;
  AttrHash *np;
  Attribute *old_local;
  TidyAttribImpl *attribs_local;
  TidyDocImpl *doc_local;
  
  if (old != (Attribute *)0x0) {
    pAVar2 = (AttrHash *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x10);
    pAVar2->attr = old;
    uVar1 = attrsHash(old->name);
    pAVar2->next = attribs->hashtab[uVar1];
    attribs->hashtab[uVar1] = pAVar2;
  }
  return old;
}

Assistant:

static const Attribute *attrsInstall(TidyDocImpl* doc, TidyAttribImpl * attribs,
                                const Attribute* old)
{
    AttrHash *np;
    uint hashval;

    if (old)
    {
        np = (AttrHash *)TidyDocAlloc(doc, sizeof(*np));
        np->attr = old;

        hashval = attrsHash(old->name);
        np->next = attribs->hashtab[hashval];
        attribs->hashtab[hashval] = np;
    }

    return old;
}